

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fGeometryShaderTests.cpp
# Opt level: O1

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::ImplementationLimitCase::iterate
          (ImplementationLimitCase *this)

{
  bool bVar1;
  int iVar2;
  GLenum err;
  undefined4 extraout_var;
  char *__s;
  size_t sVar3;
  StateQueryMemoryWriteGuard<int> result;
  CallLogWrapper gl;
  StateQueryMemoryWriteGuard<int> local_1c0;
  CallLogWrapper local_1b0;
  undefined1 local_198 [8];
  _func_int **local_190;
  ios_base local_120 [264];
  
  iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  glu::CallLogWrapper::CallLogWrapper
            (&local_1b0,(Functions *)CONCAT44(extraout_var,iVar2),
             ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log);
  local_1c0.m_preguard = -0x21212122;
  local_1c0.m_value = -0x21212122;
  local_1c0.m_postguard = -0x21212122;
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
             "Pass");
  local_198 = (undefined1  [8])
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_190);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_190,"Querying ",9);
  __s = glu::getGettableStateName(this->m_target);
  if (__s == (char *)0x0) {
    std::ios::clear((int)(ostringstream *)&local_190 + (int)local_190[-3]);
  }
  else {
    sVar3 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_190,__s,sVar3);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_190,", expecting at least ",0x15);
  std::ostream::operator<<((ostringstream *)&local_190,this->m_minValue);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_198,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_190);
  std::ios_base::~ios_base(local_120);
  local_1b0.m_enableLog = true;
  glu::CallLogWrapper::glGetIntegerv(&local_1b0,this->m_target,&local_1c0.m_value);
  err = glu::CallLogWrapper::glGetError(&local_1b0);
  glu::checkError(err,"implementation limit query failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fAndroidExtensionPackES31ATests.cpp"
                  ,0x68);
  bVar1 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::verifyValidity
                    (&local_1c0,(this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  if ((bVar1) && (local_1c0.m_value < this->m_minValue)) {
    local_198 = (undefined1  [8])
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_190);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_190,"// ERROR: Got ",0xe);
    std::ostream::operator<<((ostringstream *)&local_190,local_1c0.m_value);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_190,", expected at least ",0x14);
    std::ostream::operator<<((ostringstream *)&local_190,this->m_minValue);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_198,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_190);
    std::ios_base::~ios_base(local_120);
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
               "Too low implementation limit");
  }
  glu::CallLogWrapper::~CallLogWrapper(&local_1b0);
  return STOP;
}

Assistant:

ImplementationLimitCase::IterateResult ImplementationLimitCase::iterate (void)
{
	glu::CallLogWrapper		gl		(m_context.getRenderContext().getFunctions(), m_testCtx.getLog());
	tcu::ResultCollector	result	(m_testCtx.getLog(), " // ERROR: ");

	gl.enableLogging(true);
	verifyStateIntegerMin(result, gl, m_target, m_minValue, QUERY_INTEGER);

	{
		const tcu::ScopedLogSection	section(m_testCtx.getLog(), "Types", "Alternative queries");
		verifyStateIntegerMin(result, gl, m_target, m_minValue, QUERY_BOOLEAN);
		verifyStateIntegerMin(result, gl, m_target, m_minValue, QUERY_INTEGER64);
		verifyStateIntegerMin(result, gl, m_target, m_minValue, QUERY_FLOAT);
	}

	result.setTestContextResult(m_testCtx);
	return STOP;
}